

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O2

void __thiscall IndexIntervalTest_ToInt_Test::TestBody(IndexIntervalTest_ToInt_Test *this)

{
  Int3 *_end;
  Int3 *_step;
  int iVar1;
  char *message;
  int iVar2;
  int iVar3;
  AssertHelper local_b0;
  int idx;
  Vector3<int> local_a0;
  AssertionResult gtest_ar;
  IndexInterval<pica::Vector3<int>_> interval;
  
  _end = &(this->super_IndexIntervalTest).end;
  _step = &(this->super_IndexIntervalTest).step;
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval
            (&interval,&(this->super_IndexIntervalTest).begin,_end,_step);
  idx = 0;
  iVar2 = (this->super_IndexIntervalTest).begin.x;
  do {
    if (_end->x <= iVar2) {
      return;
    }
    for (iVar3 = (this->super_IndexIntervalTest).begin.y;
        iVar3 < (this->super_IndexIntervalTest).end.y;
        iVar3 = iVar3 + (this->super_IndexIntervalTest).step.y) {
      for (iVar1 = (this->super_IndexIntervalTest).begin.z;
          iVar1 < (this->super_IndexIntervalTest).end.z;
          iVar1 = iVar1 + (this->super_IndexIntervalTest).step.z) {
        local_a0.x = iVar2;
        local_a0.y = iVar3;
        local_a0.z = iVar1;
        local_b0.data_._0_4_ = pica::IndexInterval<pica::Vector3<int>_>::toInt(&interval,&local_a0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"idx","interval.toInt(Int3(i, j, k))",&idx,(int *)&local_b0
                  );
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = "";
          }
          else {
            message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                     ,0x9a,message);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_a0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        idx = idx + 1;
      }
    }
    iVar2 = iVar2 + _step->x;
  } while( true );
}

Assistant:

TEST_F(IndexIntervalTest, ToInt)
{
    IndexInterval<Int3> interval(begin, end, step);
    int idx = 0;
    for (int i = begin.x; i < end.x; i += step.x)
    for (int j = begin.y; j < end.y; j += step.y)
    for (int k = begin.z; k < end.z; k += step.z) {
        ASSERT_EQ(idx, interval.toInt(Int3(i, j, k)));
        idx++;
    }
}